

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test::TestBody
          (DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  string *in_R9;
  AssertHelper local_8a0;
  Message local_898;
  string local_890;
  Privkey local_870;
  string local_850;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_800;
  Message local_7f8;
  bool local_7e9;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_7b8;
  Message local_7b0;
  bool local_7a1;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_770;
  Message local_768;
  bool local_759;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_;
  Message local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_2;
  Message local_700;
  string local_6f8;
  AssertHelper local_6d8;
  Message local_6d0;
  string local_6c8;
  DescriptorKeyInfo local_6a8;
  AssertHelper local_508;
  Message local_500;
  DescriptorKeyType local_4f8;
  DescriptorKeyType local_4f4;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_1;
  Message local_4d8;
  string local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar;
  Message local_498;
  string local_490;
  AssertHelper local_470;
  Message local_468;
  allocator local_459;
  string local_458;
  DescriptorKeyInfo local_438;
  string local_298 [8];
  string key_str;
  DescriptorKeyInfo key_info;
  undefined1 local_d0 [8];
  string parent_info;
  Privkey privkey_wif;
  undefined1 local_88 [8];
  string privkey_wif_str;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey privkey;
  DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test *this_local;
  
  privkey._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"0b64eb8f5ddfffed8ffd09339cbb9de1b9ceee2a76760173fe4b130a91e56383",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_88,"cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN",
             (allocator *)((long)&privkey_wif.net_type_ + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&privkey_wif.net_type_ + 3));
  cfd::core::Privkey::FromWif
            ((Privkey *)((long)&parent_info.field_2 + 8),(string *)local_88,kRegtest,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d0,"[ef57314e/0\'/0\'/4\']",
             (allocator *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo((DescriptorKeyInfo *)((long)&key_str.field_2 + 8))
  ;
  std::__cxx11::string::string(local_298);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_458,"",&local_459);
      in_R9 = &local_458;
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                (&local_438,(Privkey *)local_30,false,kMainnet,true,in_R9);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_438);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_438);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
    }
  }
  else {
    testing::Message::Message(&local_468);
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x585,
               "Expected: key_info = DescriptorKeyInfo(privkey, false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    testing::Message::~Message(&local_468);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_490,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_298,(string *)&local_490);
      std::__cxx11::string::~string((string *)&local_490);
    }
  }
  else {
    testing::Message::Message(&local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x586,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_498);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Privkey::GetWif_abi_cxx11_(&local_4d0,(Privkey *)local_30);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4b0,"key_str.c_str()","privkey.GetWif().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x587,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4f4 = cfd::core::DescriptorKeyInfo::GetKeyType
                        ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_4f8 = kDescriptorKeyPublic;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
            ((EqHelper<false> *)local_4f0,"key_info.GetKeyType()",
             "DescriptorKeyType::kDescriptorKeyPublic",&local_4f4,&local_4f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x588,pcVar2);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_6c8,(string *)local_d0);
      in_R9 = &local_6c8;
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                (&local_6a8,(Privkey *)((long)&parent_info.field_2 + 8),true,kRegtest,true,in_R9);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_6a8);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_6a8);
      std::__cxx11::string::~string((string *)&local_6c8);
    }
  }
  else {
    testing::Message::Message(&local_6d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x58a,
               "Expected: key_info = DescriptorKeyInfo(privkey_wif, true, NetType::kRegtest, true, parent_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    testing::Message::~Message(&local_6d0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_6f8,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_298,(string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
    }
  }
  else {
    testing::Message::Message(&local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x58b,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_700);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator+(&local_738,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_718,"key_str.c_str()","(parent_info + privkey_wif_str).c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x58c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  local_759 = cfd::core::DescriptorKeyInfo::HasPrivkey
                        ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_758,&local_759,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
  if (!bVar1) {
    testing::Message::Message(&local_768);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_758,
               (AssertionResult *)"key_info.HasPrivkey()","false","true",(char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_770,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x58d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_770,&local_768);
    testing::internal::AssertHelper::~AssertHelper(&local_770);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPubkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_7a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7a0,&local_7a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_7a0,
               (AssertionResult *)"key_info.HasExtPubkey()","true","false",(char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x58e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper(&local_7b8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPrivkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_7e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7e8,&local_7e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_7f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_7e8,
               (AssertionResult *)"key_info.HasExtPrivkey()","true","false",(char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x58f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_800);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  cfd::core::DescriptorKeyInfo::GetPrivkey
            (&local_870,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_850,&local_870);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_890,(Privkey *)((long)&parent_info.field_2 + 8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_830,"key_info.GetPrivkey().GetHex().c_str()",
             "privkey_wif.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_850);
  cfd::core::Privkey::~Privkey(&local_870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(&local_898);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x590,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8a0,&local_898);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  std::__cxx11::string::~string(local_298);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo
            ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  std::__cxx11::string::~string((string *)local_d0);
  cfd::core::Privkey::~Privkey((Privkey *)((long)&parent_info.field_2 + 8));
  std::__cxx11::string::~string((string *)local_88);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_Privkey_Testnet_Compress) {
  Privkey privkey("0b64eb8f5ddfffed8ffd09339cbb9de1b9ceee2a76760173fe4b130a91e56383");
  std::string privkey_wif_str = "cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN";
  Privkey privkey_wif = Privkey::FromWif(privkey_wif_str, NetType::kRegtest, true);
  std::string parent_info = "[ef57314e/0'/0'/4']";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(privkey, false));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), privkey.GetWif().c_str());
  EXPECT_EQ(key_info.GetKeyType(),  DescriptorKeyType::kDescriptorKeyPublic);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(privkey_wif, true, NetType::kRegtest, true, parent_info));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + privkey_wif_str).c_str());
  EXPECT_TRUE(key_info.HasPrivkey());
  EXPECT_FALSE(key_info.HasExtPubkey());
  EXPECT_FALSE(key_info.HasExtPrivkey());
  EXPECT_STREQ(key_info.GetPrivkey().GetHex().c_str(),  privkey_wif.GetHex().c_str());
}